

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void crec_finalizer(jit_State *J,TRef trcd,cTValue *fin)

{
  uint k;
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  
  TVar1 = lj_ir_call(J,IRCALL_lj_cdata_setfin,trcd);
  TVar2 = lj_ir_kint(J,4);
  (J->fold).ins.field_0.ot = 0x2805;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  TVar2 = lj_opt_fold(J);
  k = (fin->field_2).it;
  if ((k | 2) == 0xfffffff7) {
    TVar3 = lj_ir_kgc(J,(GCobj *)(ulong)(fin->u32).lo,~k);
    (J->fold).ins.field_0.ot = 0x4b05;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
    TVar1 = lj_ir_kint(J,k);
    (J->fold).ins.field_0.ot = 0x4b13;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    lj_opt_fold(J);
    J->needsnap = '\x01';
    return;
  }
  lj_trace_err(J,LJ_TRERR_BADTYPE);
}

Assistant:

static void crec_finalizer(jit_State *J, TRef trcd, cTValue *fin)
{
  TRef trlo = lj_ir_call(J, IRCALL_lj_cdata_setfin, trcd);
  TRef trhi = emitir(IRT(IR_ADD, IRT_P32), trlo, lj_ir_kint(J, 4));
  if (LJ_BE) { TRef tmp = trlo; trlo = trhi; trhi = tmp; }
  if (tvisfunc(fin)) {
    emitir(IRT(IR_XSTORE, IRT_P32), trlo, lj_ir_kfunc(J, funcV(fin)));
    emitir(IRTI(IR_XSTORE), trhi, lj_ir_kint(J, LJ_TFUNC));
  } else if (tviscdata(fin)) {
    emitir(IRT(IR_XSTORE, IRT_P32), trlo,
	   lj_ir_kgc(J, obj2gco(cdataV(fin)), IRT_CDATA));
    emitir(IRTI(IR_XSTORE), trhi, lj_ir_kint(J, LJ_TCDATA));
  } else {
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  J->needsnap = 1;
}